

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  xmlXPathObjectPtr pxVar6;
  xmlChar *str;
  byte bVar7;
  byte *pbVar8;
  xmlChar *pxVar9;
  uint uVar10;
  byte *pbVar11;
  int iVar12;
  byte *pbVar13;
  byte bVar14;
  long lVar15;
  double dVar16;
  void *pvVar17;
  undefined8 local_48;
  void *local_40;
  double local_38;
  
  pbVar13 = ctxt->cur;
  while( true ) {
    pbVar8 = pbVar13 + 1;
    bVar7 = *pbVar13;
    uVar5 = (ulong)bVar7;
    if (0x28 < uVar5) break;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar5 & 0x3f) & 1) != 0) goto switchD_001e8a61_caseD_27;
      break;
    }
    ctxt->cur = pbVar8;
    pbVar13 = pbVar8;
  }
  if ((byte)(bVar7 - 0x30) < 10) goto switchD_001e8a61_caseD_27;
  switch(bVar7) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001e8a61_caseD_28:
    pbVar13 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
    pxVar9 = ctxt->cur;
    uVar4 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0))
    goto LAB_001e8df2;
    if (uVar4 < 0x100) {
      if ((uVar4 - 0xc0 < 0x17 || (uVar4 & 0xdf) - 0x41 < 0x1a) ||
         (0xf7 < uVar4 || uVar4 - 0xd8 < 0x1f)) goto LAB_001e92ba;
LAB_001e95c5:
      if (uVar4 < 0x100) {
        if (((char)uVar4 == '_') || ((uVar4 & 0xff) == 0x3a)) goto LAB_001e92ba;
      }
      else if ((uVar4 - 0x3021 < 9 || uVar4 - 0x4e00 < 0x51a6) || uVar4 == 0x3007)
      goto LAB_001e92ba;
LAB_001e8df2:
      str = (xmlChar *)0x0;
    }
    else {
      iVar12 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
      if (iVar12 == 0) goto LAB_001e95c5;
LAB_001e92ba:
      while ((0x3e < uVar4 || ((0x4000800100000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0))) {
        if (uVar4 < 0x100) {
          if ((0x16 < uVar4 - 0xc0 && 0x19 < (uVar4 & 0xdf) - 0x41) &&
             (uVar4 < 0xf8 && 0x1e < uVar4 - 0xd8)) {
LAB_001e9331:
            if (uVar4 < 0x100) {
              if (9 < uVar4 - 0x30) {
LAB_001e9384:
                if ((0x32 < uVar4 - 0x2d) ||
                   ((0x4000000002003U >> ((ulong)(uVar4 - 0x2d) & 0x3f) & 1) == 0)) {
                  if (uVar4 < 0x100) {
                    uVar4 = (uint)(uVar4 == 0xb7);
                  }
                  else {
                    iVar12 = xmlCharInRange(uVar4,&xmlIsCombiningGroup);
                    if (iVar12 != 0) goto LAB_001e939d;
                    uVar4 = xmlCharInRange(uVar4,&xmlIsExtenderGroup);
                  }
                  if (uVar4 == 0) break;
                }
              }
            }
            else if (((8 < uVar4 - 0x3021 && 0x51a5 < uVar4 - 0x4e00) && uVar4 != 0x3007) &&
                    (iVar12 = xmlCharInRange(uVar4,&xmlIsDigitGroup), iVar12 == 0))
            goto LAB_001e9384;
          }
        }
        else {
          iVar12 = xmlCharInRange(uVar4,&xmlIsBaseCharGroup);
          if (iVar12 == 0) goto LAB_001e9331;
        }
LAB_001e939d:
        ctxt->cur = ctxt->cur + (int)local_48;
        uVar4 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
      }
      str = xmlStrndup(pxVar9,*(int *)&ctxt->cur - (int)pxVar9);
      ctxt->cur = pxVar9;
    }
    if (str == (xmlChar *)0x0) {
      xmlXPathErr(ctxt,7);
      return;
    }
    pxVar9 = xmlStrstr(str,(xmlChar *)"::");
    if (pxVar9 == (xmlChar *)0x0) {
      iVar12 = xmlStrlen(str);
      lVar15 = (long)iVar12;
      do {
        xVar1 = ctxt->cur[lVar15];
        if (xVar1 != ' ') {
          bVar2 = false;
          if ((xVar1 == '\0') || (bVar2 = false, xVar1 == '/')) goto LAB_001e95fd;
          if ((1 < (byte)(xVar1 - 9)) && (xVar1 != '\r')) goto LAB_001e95ea;
        }
        lVar15 = lVar15 + 1;
      } while( true );
    }
    (*xmlFree)(str);
  case 0x2a:
  case 0x2f:
switchD_001e8a61_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,*ctxt->cur == '/' ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar13 = ctxt->cur;
    while( true ) {
      uVar5 = (ulong)*pbVar13;
      if (0x2f < uVar5) break;
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
        if (uVar5 == 0x2f) goto LAB_001e949f;
        break;
      }
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
    goto LAB_001e954a;
  case 0x2e:
    if (9 < (byte)(*pbVar8 - 0x30)) {
      if ((0x16 < bVar7 - 0x2a) || ((0x400031U >> (bVar7 - 0x2a & 0x1f) & 1) == 0))
      goto switchD_001e8a61_caseD_28;
      goto switchD_001e8a61_caseD_2a;
    }
    break;
  default:
    if (bVar7 != 0x22) {
      if (bVar7 != 0x40) goto switchD_001e8a61_caseD_28;
      goto switchD_001e8a61_caseD_2a;
    }
  }
switchD_001e8a61_caseD_27:
  pbVar8 = ctxt->cur + 1;
  pbVar13 = pbVar8;
  while( true ) {
    bVar7 = pbVar13[-1];
    uVar5 = (ulong)bVar7;
    if (0x28 < uVar5) break;
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0x24) goto LAB_001e8914;
      if (uVar5 == 0x28) goto LAB_001e88ef;
      break;
    }
    ctxt->cur = pbVar13;
    pbVar13 = pbVar13 + 1;
    pbVar8 = pbVar8 + 1;
  }
  bVar14 = bVar7 - 0x30;
  if (bVar14 < 10) {
LAB_001e89d5:
    if (ctxt->error == 0) {
      if (bVar7 != 0x2e && (byte)(bVar7 - 0x3a) < 0xf6) {
        iVar12 = 1;
        goto LAB_001e8b6a;
      }
      if (bVar14 < 10) {
        pvVar17 = (void *)0x0;
        do {
          ctxt->cur = pbVar13;
          pvVar17 = (void *)((double)((byte)uVar5 & 0xf) + (double)pvVar17 * 10.0);
          bVar7 = *pbVar13;
          uVar5 = (ulong)bVar7;
          pbVar13 = pbVar13 + 1;
        } while ((byte)(bVar7 - 0x30) < 10);
      }
      else {
        pvVar17 = (void *)0x0;
      }
      if (bVar7 == 0x2e) {
        ctxt->cur = pbVar13;
        bVar7 = *pbVar13;
        local_40 = pvVar17;
        if (bVar7 < 0x30) {
          if (bVar14 < 10) goto LAB_001e8ff8;
LAB_001e8fde:
          xmlXPathErr(ctxt,1);
          bVar2 = false;
          pvVar17 = local_40;
        }
        else {
          if ((9 < bVar14) && (0x39 < bVar7)) goto LAB_001e8fde;
LAB_001e8ff8:
          uVar5 = 0;
          if (bVar7 == 0x30) {
            uVar5 = 0;
            do {
              ctxt->cur = pbVar13 + uVar5 + 1;
              lVar15 = uVar5 + 1;
              uVar5 = uVar5 + 1;
            } while (pbVar13[lVar15] == 0x30);
          }
          uVar4 = (uint)uVar5;
          pbVar13 = ctxt->cur;
          bVar7 = *pbVar13;
          local_38 = 0.0;
          if ((byte)(bVar7 - 0x30) < 10) {
            uVar10 = uVar4 + 0x14;
            do {
              pbVar13 = pbVar13 + 1;
              local_38 = local_38 * 10.0 + (double)(int)(bVar7 - 0x30);
              uVar4 = (int)uVar5 + 1;
              uVar5 = (ulong)uVar4;
              ctxt->cur = pbVar13;
              bVar7 = *pbVar13;
              if (9 < (byte)(bVar7 - 0x30)) break;
            } while (uVar4 < uVar10);
          }
          dVar16 = pow(10.0,(double)(int)uVar4);
          pxVar9 = ctxt->cur;
          bVar2 = true;
          xVar1 = *pxVar9;
          while (pvVar17 = (void *)((double)local_40 + local_38 / dVar16), (byte)(xVar1 - 0x30) < 10
                ) {
            pxVar9 = pxVar9 + 1;
            ctxt->cur = pxVar9;
            xVar1 = *pxVar9;
          }
        }
        if (!bVar2) goto LAB_001e8b6f;
      }
      pbVar13 = ctxt->cur;
      if ((*pbVar13 | 0x20) == 0x65) {
        ctxt->cur = pbVar13 + 1;
        bVar7 = pbVar13[1];
        if ((bVar7 == 0x2d) || (bVar7 == 0x2b)) {
          ctxt->cur = pbVar13 + 2;
        }
        pbVar13 = ctxt->cur;
        bVar14 = *pbVar13;
        iVar12 = 0;
        if ((byte)(bVar14 - 0x30) < 10) {
          iVar12 = 0;
          do {
            pbVar13 = pbVar13 + 1;
            iVar3 = (bVar14 - 0x30) + iVar12 * 10;
            if (999999 < iVar12) {
              iVar3 = iVar12;
            }
            iVar12 = iVar3;
            ctxt->cur = pbVar13;
            bVar14 = *pbVar13;
          } while ((byte)(bVar14 - 0x30) < 10);
        }
        iVar3 = -iVar12;
        if (bVar7 != 0x2d) {
          iVar3 = iVar12;
        }
        local_40 = pvVar17;
        dVar16 = pow(10.0,(double)iVar3);
        pvVar17 = (void *)((double)local_40 * dVar16);
      }
      pxVar6 = xmlXPathCacheNewFloat(ctxt->context,(double)pvVar17);
      if (pxVar6 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar6,
                                     (void *)0x0);
        if (iVar12 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar6);
        }
      }
    }
  }
  else {
    pbVar11 = pbVar13;
    if (bVar7 == 0x22) {
      while( true ) {
        ctxt->cur = pbVar11;
        bVar7 = *pbVar11;
        uVar4 = (uint)bVar7;
        uVar10 = (uint)bVar7;
        bVar14 = bVar7 - 9;
        do {
          if (bVar7 < 0x20) {
            uVar4 = uVar10;
            if ((0xd < uVar10) || ((0x2600U >> (uVar10 & 0x1f) & 1) == 0)) goto LAB_001e8c9a;
            goto LAB_001e8b01;
          }
        } while (uVar10 == 0);
        if (uVar10 == 0x22) break;
LAB_001e8b01:
        pbVar11 = pbVar11 + 1;
      }
    }
    else {
      if (bVar7 != 0x27) {
        if ((bVar7 == 0x2e) && ((byte)(*pbVar13 - 0x30) < 10)) goto LAB_001e89d5;
        pxVar9 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
        if (pxVar9 == (xmlChar *)0x0) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        }
        else {
          pbVar13 = ctxt->cur;
          while( true ) {
            pbVar8 = pbVar13 + 1;
            uVar5 = (ulong)*pbVar13;
            if (0x28 < uVar5) break;
            if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
              if (uVar5 == 0x28) goto LAB_001e8e11;
              break;
            }
            ctxt->cur = pbVar8;
            pbVar13 = pbVar8;
          }
          (*xmlFree)(pxVar9);
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
        }
        iVar12 = 7;
        goto LAB_001e8b6a;
      }
      while( true ) {
        ctxt->cur = pbVar11;
        bVar7 = *pbVar11;
        uVar4 = (uint)bVar7;
        bVar14 = bVar7 - 9;
        do {
          if (bVar7 < 0x20) {
            if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001e8c9a;
            goto LAB_001e8c95;
          }
        } while (uVar4 == 0);
        if (uVar4 == 0x27) break;
LAB_001e8c95:
        pbVar11 = pbVar11 + 1;
      }
    }
LAB_001e8c9a:
    if ((bVar14 < 2) || (0x1f < (byte)uVar4 || uVar4 == 0xd)) {
      pxVar9 = xmlStrndup(pbVar13,(int)pbVar11 - (int)pbVar8);
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      if (pxVar9 != (xmlChar *)0x0) {
        pxVar6 = xmlXPathCacheNewString(ctxt->context,pxVar9);
        if (pxVar6 == (xmlXPathObjectPtr)0x0) {
          ctxt->error = 0xf;
        }
        else {
          iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar6,
                                       (void *)0x0);
          if (iVar12 == -1) {
            xmlXPathReleaseObject(ctxt->context,pxVar6);
          }
        }
        (*xmlFree)(pxVar9);
      }
    }
    else {
      iVar12 = 2;
LAB_001e8b6a:
      xmlXPathErr(ctxt,iVar12);
    }
  }
LAB_001e8b6f:
  pbVar13 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar13 + 1;
    pbVar13 = pbVar13 + 1;
  }
LAB_001e8b97:
  if (ctxt->error == 0) {
    pbVar13 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
    while (*ctxt->cur == '[') {
      xmlXPathCompPredicate(ctxt,1);
      pbVar13 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        break;
        ctxt->cur = pbVar13 + 1;
        pbVar13 = pbVar13 + 1;
      }
    }
  }
  if (ctxt->error == 0) {
    pxVar9 = ctxt->cur;
    if (*pxVar9 == '/') {
      if (pxVar9[1] == '/') {
        pbVar13 = pxVar9 + 2;
        while( true ) {
          ctxt->cur = pbVar13;
          if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
          break;
          pbVar13 = pbVar13 + 1;
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
      }
LAB_001e954a:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
LAB_001e9552:
    pbVar13 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
  }
  return;
LAB_001e95ea:
  if (((xVar1 == '(') && (iVar12 = xmlXPathIsNodeType(str), iVar12 == 0)) &&
     ((ctxt->xptr == 0 || (iVar12 = xmlStrEqual(str,(xmlChar *)"range-to"), iVar12 == 0)))) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
LAB_001e95fd:
  xVar1 = ctxt->cur[lVar15];
  (*xmlFree)(str);
  if ((!bVar2) || (xVar1 == '\0')) goto switchD_001e8a61_caseD_2a;
  goto switchD_001e8a61_caseD_27;
LAB_001e949f:
  do {
    pbVar13 = ctxt->cur;
    if (*pbVar13 != 0x2f) break;
    if (pbVar13[1] == 0x2f) {
      pbVar13 = pbVar13 + 2;
      while( true ) {
        ctxt->cur = pbVar13;
        if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        break;
        pbVar13 = pbVar13 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001e9536:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar13 = pbVar13 + 1;
        ctxt->cur = pbVar13;
        bVar7 = *pbVar13;
        uVar5 = (ulong)bVar7;
        if (0x20 < uVar5) goto LAB_001e94e6;
      } while ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0);
      if (uVar5 != 0) {
LAB_001e94e6:
        if (((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a) ||
           ((bVar7 - 0x2a < 0x36 && ((0x20000000400011U >> ((ulong)(bVar7 - 0x2a) & 0x3f) & 1) != 0)
            ))) goto LAB_001e9536;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001e9552;
LAB_001e8914:
  uVar5 = (ulong)pbVar13[-1];
  if (uVar5 < 0x25) {
    if ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_001e890e;
    if (uVar5 == 0x24) {
      ctxt->cur = pbVar13;
      pxVar9 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
      if (pxVar9 != (xmlChar *)0x0) {
        ctxt->comp->last = -1;
        iVar12 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar9,
                                     (void *)CONCAT44(local_48._4_4_,(int)local_48));
        if (iVar12 == -1) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          (*xmlFree)(pxVar9);
        }
        pbVar13 = ctxt->cur;
        while( true ) {
          if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
          break;
          ctxt->cur = pbVar13 + 1;
          pbVar13 = pbVar13 + 1;
        }
        if ((ctxt->context != (xmlXPathContextPtr)0x0) &&
           (iVar12 = 0x18, (ctxt->context->flags & 2) != 0)) goto LAB_001e8b6a;
        goto LAB_001e8b6f;
      }
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
  }
  goto LAB_001e8b62;
LAB_001e890e:
  ctxt->cur = pbVar13;
  pbVar13 = pbVar13 + 1;
  goto LAB_001e8914;
LAB_001e8b62:
  iVar12 = 4;
  goto LAB_001e8b6a;
LAB_001e88ef:
  while( true ) {
    ctxt->cur = pbVar13;
    if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
    pbVar13 = pbVar13 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar13 = ctxt->cur;
    if (*pbVar13 == 0x29) {
      do {
        pbVar13 = pbVar13 + 1;
        ctxt->cur = pbVar13;
        if (0x20 < (ulong)*pbVar13) break;
      } while ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0);
      goto LAB_001e8b6f;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001e8b97;
LAB_001e8e11:
  while( true ) {
    ctxt->cur = pbVar8;
    if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0)) break;
    pbVar8 = pbVar8 + 1;
  }
  local_40 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  uVar4 = 1;
  if ((local_40 == (void *)0x0) && (*pxVar9 == 'c')) {
    iVar12 = xmlStrEqual(pxVar9,(xmlChar *)"count");
    uVar4 = (uint)(iVar12 == 0);
  }
  ctxt->comp->last = -1;
  iVar12 = 0;
  if (*ctxt->cur == ')') {
LAB_001e9225:
    pvVar17 = local_40;
    iVar12 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_FUNCTION,iVar12,0,0,pxVar9,
                                 local_40);
    if (iVar12 == -1) {
      (*xmlFree)(pvVar17);
      (*xmlFree)(pxVar9);
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    pbVar13 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar13) || ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar13 + 1;
      pbVar13 = pbVar13 + 1;
    }
  }
  else {
    iVar12 = 0;
    do {
      if (*ctxt->cur == '\0') goto LAB_001e9225;
      iVar3 = ctxt->comp->last;
      ctxt->comp->last = -1;
      xmlXPathCompileExpr(ctxt,uVar4);
      if (ctxt->error == 0) {
        xmlXPathCompExprAdd(ctxt,iVar3,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0);
        iVar12 = iVar12 + 1;
        pbVar13 = ctxt->cur;
        if (*pbVar13 == 0x29) {
          iVar3 = 7;
        }
        else {
          if (*pbVar13 != 0x2c) {
            (*xmlFree)(pxVar9);
            (*xmlFree)(local_40);
            xmlXPathErr(ctxt,7);
            goto LAB_001e8f1a;
          }
          do {
            pbVar13 = pbVar13 + 1;
            ctxt->cur = pbVar13;
            if (0x20 < (ulong)*pbVar13) break;
          } while ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0);
          iVar3 = 0;
        }
      }
      else {
        (*xmlFree)(pxVar9);
        (*xmlFree)(local_40);
LAB_001e8f1a:
        iVar3 = 1;
      }
    } while (iVar3 == 0);
    if (iVar3 == 7) goto LAB_001e9225;
  }
  goto LAB_001e8b6f;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}